

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

void __thiscall presolve::HPresolve::removeRow(HPresolve *this,HighsInt row)

{
  bool bVar1;
  uint *puVar2;
  HPresolve *in_RDI;
  HighsInt rowiter;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  undefined4 in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_20;
  vector<int,_std::allocator<int>_> *local_18;
  
  markRowDeleted((HPresolve *)__end1._M_current,rowiter);
  storeRow((HPresolve *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
           (HighsInt)((ulong)in_RDI >> 0x20));
  local_18 = &in_RDI->rowpositions;
  local_20._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)in_RDI);
  std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)in_RDI);
    if (!bVar1) break;
    puVar2 = (uint *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&local_20);
    in_stack_ffffffffffffffd4 = *puVar2;
    unlink(in_RDI,(char *)(ulong)in_stack_ffffffffffffffd4);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_20);
  }
  return;
}

Assistant:

void HPresolve::removeRow(HighsInt row) {
  assert(row >= 0);
  assert(static_cast<size_t>(row) < rowroot.size());
  // first mark the row as logically deleted, so that it is not register as
  // singleton row upon removing its nonzeros
  markRowDeleted(row);
  storeRow(row);
  for (HighsInt rowiter : rowpositions) {
    assert(Arow[rowiter] == row);
    unlink(rowiter);
  }
}